

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkCRetime(Abc_Ntk_t *pNtk,int fVerbose)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vControls;
  void **ppvVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Obj_t *pObj;
  char *pName;
  Abc_Ntk_t *pNtkNew;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int Entry;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  void *pvVar14;
  Vec_Int_t *vFlopClassesNew;
  uint local_68;
  uint local_64;
  uint local_4c;
  ulong local_48;
  Vec_Int_t *local_38;
  
  pNtk_00 = Abc_NtkDup(pNtk);
  vControls = (Vec_Ptr_t *)malloc(0x10);
  vControls->nCap = 100;
  vControls->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vControls->pArray = ppvVar5;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  pVVar7 = pNtk_00->vBoxes;
  if (pVVar7->nSize < 1) {
    uVar12 = 0;
    local_4c = 0;
    uVar10 = 0;
    uVar13 = 0;
    uVar8 = 0;
  }
  else {
    local_48 = 100;
    uVar8 = 0;
    uVar11 = 0;
    lVar9 = 0;
    local_68 = 0;
    local_4c = 0;
    local_64 = 0;
    uVar13 = 0;
    do {
      plVar1 = (long *)pVVar7->pArray[lVar9];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
        plVar3 = *(long **)(lVar2 + (long)*(int *)plVar1[4] * 8);
        pAVar4 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        if ((pAVar4->vFanins).nSize == 3) {
          pvVar14 = *(void **)(lVar2 + (long)*(int *)plVar1[6] * 8);
          piVar6 = (pAVar4->vFanins).pArray;
          ppvVar5 = pAVar4->pNtk->vObjs->pArray;
          if (ppvVar5[piVar6[1]] == pvVar14) {
            Vec_IntPush(p,-1);
            local_4c = local_4c + 1;
          }
          else if (ppvVar5[piVar6[2]] == pvVar14) {
            pvVar14 = ppvVar5[*piVar6];
            if (0 < (int)uVar11) {
              uVar10 = 0;
              do {
                if (vControls->pArray[uVar10] == pvVar14) goto LAB_008609f2;
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            uVar8 = (uint)local_48;
            if (uVar11 == uVar8) {
              if ((int)uVar8 < 0x10) {
                if (vControls->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vControls->pArray,0x80);
                }
                vControls->pArray = ppvVar5;
                vControls->nCap = 0x10;
                local_48 = 0x10;
              }
              else {
                local_48 = (ulong)(uVar8 * 2);
                if (vControls->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(local_48 * 8);
                }
                else {
                  ppvVar5 = (void **)realloc(vControls->pArray,local_48 * 8);
                }
                vControls->pArray = ppvVar5;
                vControls->nCap = uVar8 * 2;
              }
            }
            else {
              ppvVar5 = vControls->pArray;
            }
            vControls->nSize = uVar11 + 1;
            ppvVar5[(int)uVar11] = pvVar14;
            pvVar14 = pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
            uVar8 = uVar11 + 1;
LAB_008609f2:
            uVar11 = uVar8;
            Entry = -1;
            if (0 < (int)uVar11) {
              uVar10 = 0;
              do {
                if (vControls->pArray[uVar10] == pvVar14) {
                  Entry = (int)uVar10;
                  break;
                }
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            local_68 = local_68 + 1;
            Vec_IntPush(p,Entry);
            Abc_ObjPatchFanin(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8),pAVar4,
                              (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[1]])
            ;
            uVar8 = uVar11;
          }
          else {
            Vec_IntPush(p,-1);
            local_64 = local_64 + 1;
          }
        }
        else {
          Vec_IntPush(p,-1);
          uVar13 = uVar13 + 1;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pNtk_00->vBoxes;
    } while (lVar9 < pVVar7->nSize);
    if (local_4c == 0) {
      local_4c = 0;
    }
    else {
      printf("Opposite phase enable is present in %d flops (out of %d).\n",(ulong)local_4c,
             (ulong)(uint)pNtk_00->nObjCounts[8]);
    }
    uVar12 = (ulong)local_68;
    uVar10 = (ulong)local_64;
  }
  if (fVerbose != 0) {
    printf("CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n",(ulong)uVar13,
           uVar10,(ulong)local_4c,uVar12,(ulong)uVar8);
  }
  if (0 < (int)uVar8) {
    ppvVar5 = vControls->pArray;
    uVar10 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)ppvVar5[uVar10];
      pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
      Abc_ObjAddFanin(pObj,pAVar4);
      pName = Abc_ObjName(pObj);
      Abc_ObjAssignName(pObj,pName,(char *)0x0);
      ppvVar5[uVar10] = pObj;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  Abc_NtkOrderCisCos(pNtk_00);
  Abc_NtkCleanup(pNtk_00,fVerbose);
  pNtkNew = Abc_NtkRetimeWithClassesNtk(pNtk_00,p,&local_38,fVerbose);
  Abc_NtkTransformBack(pNtk_00,pNtkNew,vControls,local_38);
  Abc_NtkDelete(pNtk_00);
  if (vControls->pArray != (void **)0x0) {
    free(vControls->pArray);
  }
  free(vControls);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkCRetime( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vControls;
    Vec_Int_t * vFlopClasses, * vFlopClassesNew;
    Abc_Obj_t * pObj, * pDriver, * pFlopOut, * pObjPo;
    int i, iFlop, CountN = 0, Count2 = 0, Count1 = 0, Count0 = 0;

    // duplicate the AIG
    pNtk = Abc_NtkDup( pNtk );

    // update registers
    vControls    = Vec_PtrAlloc( 100 );
    vFlopClasses = Vec_IntAlloc( 100 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pFlopOut = Abc_ObjFanout0(pObj);
        pDriver = Abc_ObjFanin0( Abc_ObjFanin0(pObj) );
        if ( Abc_ObjFaninNum(pDriver) != 3 )
        {
            Vec_IntPush( vFlopClasses, -1 );
            CountN++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) != pFlopOut && Abc_ObjFanin(pDriver, 2) != pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count2++;
            continue;
        }
        if ( Abc_ObjFanin(pDriver, 1) == pFlopOut )
        {
            Vec_IntPush( vFlopClasses, -1 );
            Count1++;
            continue;
        }
        assert( Abc_ObjFanin(pDriver, 2) == pFlopOut );
        Count0++;
        Vec_PtrPushUnique( vControls, Abc_ObjFanin0(pDriver) );
        // set the flop class
        iFlop = Vec_PtrFind( vControls, Abc_ObjFanin0(pDriver) );
        Vec_IntPush( vFlopClasses, iFlop );
        // update
        Abc_ObjPatchFanin( Abc_ObjFanin0(pObj), pDriver, Abc_ObjFanin(pDriver, 1) );
    }
    if ( Count1 )
        printf( "Opposite phase enable is present in %d flops (out of %d).\n", Count1, Abc_NtkLatchNum(pNtk) );
    if ( fVerbose )
    printf( "CountN = %4d. Count2 = %4d. Count1 = %4d. Count0 = %4d. Ctrls = %d.\n", 
        CountN, Count2, Count1, Count0, Vec_PtrSize(vControls) );

    // add the controls to the list of POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vControls, pObj, i )
    {
        pObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pObjPo, pObj );
        Abc_ObjAssignName( pObjPo, Abc_ObjName(pObjPo), NULL );
        Vec_PtrWriteEntry( vControls, i, pObjPo );
    }
    Abc_NtkOrderCisCos( pNtk );
    Abc_NtkCleanup( pNtk, fVerbose );

    // performs retiming with classes
    pNtkNew = Abc_NtkRetimeWithClassesNtk( pNtk, vFlopClasses, &vFlopClassesNew, fVerbose );
    Abc_NtkTransformBack( pNtk, pNtkNew, vControls, vFlopClassesNew );
//    assert( Abc_NtkPoNum(pNtkNew) == Abc_NtkPoNum(pNtk) );
    Abc_NtkDelete( pNtk );

    Vec_PtrFree( vControls );
//    Vec_IntFree( vFlopClasses );
    Vec_IntFree( vFlopClassesNew );
    return pNtkNew;
}